

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADEC-CORE.cpp
# Opt level: O3

void build_non_adjacent_table
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges)

{
  pointer *pppVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  iterator __position;
  void *__s;
  long lVar5;
  long lVar6;
  long lVar7;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  pair<int,_int> *e;
  pointer ppVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  pair<int,_int> pVar12;
  pair<int,_int> pVar13;
  pair<int,_int> local_38;
  
  iVar11 = size;
  uVar9 = (ulong)size;
  __s = operator_new__((ulong)(uint)(size * size));
  memset(__s,0,uVar9 * uVar9);
  ppVar3 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar8 = ppVar3;
  if (ppVar3 != ppVar4) {
    do {
      iVar10 = ppVar8->first;
      iVar2 = ppVar8->second;
      *(undefined1 *)((long)__s + (long)(iVar10 * iVar11 + iVar2)) = 1;
      *(undefined1 *)((long)__s + (long)(iVar2 * iVar11 + iVar10)) = 1;
      ppVar8 = ppVar8 + 1;
    } while (ppVar8 != ppVar4);
    if (ppVar3 != ppVar4) {
      (edges->super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = ppVar3;
    }
  }
  if (0 < iVar11) {
    iVar11 = 1;
    pVar13.first = 0;
    pVar13.second = 1;
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      lVar7 = (long)(int)uVar9;
      pVar12 = pVar13;
      iVar10 = iVar11;
      if (lVar6 < lVar7) {
        do {
          if (*(char *)((long)__s + (long)((int)lVar5 * (int)uVar9 + iVar10)) == '\0') {
            __position._M_current =
                 (edges->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            local_38 = pVar12;
            if (__position._M_current ==
                (edges->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)edges,
                         __position,&local_38);
              uVar9 = (ulong)(uint)size;
            }
            else {
              *__position._M_current = pVar12;
              pppVar1 = &(edges->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          iVar10 = iVar10 + 1;
          pVar12 = (pair<int,_int>)((long)pVar12 + 0x100000000);
        } while (iVar10 < (int)uVar9);
        lVar7 = (long)(int)uVar9;
      }
      iVar11 = iVar11 + 1;
      pVar13 = (pair<int,_int>)((long)pVar13 + 0x100000001);
      lVar5 = lVar6;
    } while (lVar6 < lVar7);
  }
  operator_delete__(__s);
  build_adjacent_table(edges,&NAdjB,NAdjP);
  return;
}

Assistant:

void build_non_adjacent_table(vector<pair<int, int> > edges) {
    bool *graph = new bool[size * size];
    memset(graph, 0, sizeof(bool) * size * size);
    for (auto &e: edges) {
        graph[e.first * size + e.second] = true;
        graph[e.second * size + e.first] = true;
    }
    edges.clear();
    for (int i = 0; i < size; ++i) 
        for (int j = i+1; j < size; ++j) if (!graph[i * size + j]) {
            edges.push_back(make_pair(i, j));
        }
    delete[] graph;
    build_adjacent_table(edges, &NAdjB, NAdjP);
}